

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_2U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_2U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint uVar3;
  float *__src;
  uint uVar4;
  byte *__dest;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  float fVar8;
  uint16_t outValue;
  float outValue_1;
  ushort local_50;
  allocator_type local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  float local_3c;
  ulong local_38;
  
  if (2 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 2>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 2]"
                 );
  }
  local_4c = targetBits >> 3;
  local_48 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(local_4c * numChannels * (this->super_Image).height * (this->super_Image).width
                    ),&local_4d);
  uVar7 = (this->super_Image).height;
  pvVar2 = local_48;
  if (uVar7 != 0) {
    local_38 = (ulong)local_4c;
    uVar4 = (this->super_Image).width;
    uVar5 = 0;
    uVar3 = uVar4;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar7 = 0;
        do {
          if (numChannels != 0) {
            uVar6 = 0;
            do {
              uVar4 = (this->super_Image).width * uVar5 + uVar7;
              bVar1 = *(byte *)((long)this->pixels + (((ulong)uVar4 * 2 + 1) - (ulong)(uVar6 == 0)))
              ;
              __dest = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start +
                       (uVar4 * numChannels + uVar6) * local_4c;
              if (targetBits == 0x20) {
                local_3c = (float)bVar1;
                __src = &local_3c;
LAB_00199545:
                memcpy(__dest,__src,local_38);
                pvVar2 = local_48;
              }
              else {
                if (targetBits == 0x10) {
                  fVar8 = (float)bVar1;
                  uVar4 = (uint)fVar8 >> 0x17;
                  if (uVar4 == 0) {
                    local_50 = 0;
                  }
                  else if (uVar4 == 0xff) {
                    local_50 = (((uint)fVar8 & 0x7fffff) != 0 | 0x3e) << 9;
                  }
                  else {
                    local_50 = 0x7c00;
                    if ((uint)fVar8 < 0x47800000) {
                      if ((uint)fVar8 < 0x38800000) {
                        if ((uint)fVar8 < 0x33000000) {
                          local_50 = 0;
                          goto LAB_00199536;
                        }
                        uVar3 = (uint)fVar8 & 0x7fffff | 0x800000;
                        local_50 = (ushort)(uVar3 >> (0x7eU - (char)uVar4 & 0x1f));
                        uVar3 = uVar3 >> ((byte)(0x7d - (char)uVar4) & 0x1f);
                      }
                      else {
                        local_50 = ((ushort)((uint)fVar8 >> 0xd) & 0x3ff |
                                   (ushort)((uVar4 & 0x1f) << 10)) ^ 0x4000;
                        uVar3 = (uint)fVar8 >> 0xc;
                      }
                      local_50 = local_50 + ((uVar3 & 1) != 0);
                    }
LAB_00199536:
                    local_50 = local_50 & 0x7fff;
                  }
                  __src = (float *)&local_50;
                  goto LAB_00199545;
                }
                if (targetBits == 8) {
                  *__dest = bVar1;
                }
              }
              uVar6 = uVar6 + 1;
            } while (numChannels != uVar6);
            uVar4 = (this->super_Image).width;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar4);
        uVar7 = (this->super_Image).height;
        uVar3 = uVar4;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar7);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }